

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,String *params_12,ArrayPtr<const_char> *params_13,
          StringTree *params_14,StringTree *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,String *params_20,ArrayPtr<const_char> *params_21,
          String *params_22,ArrayPtr<const_char> *params_23,ArrayPtr<const_char> *params_24,
          ArrayPtr<const_char> *params_25,StringTree *params_26,ArrayPtr<const_char> *params_27)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  String local_188;
  size_t local_168;
  char *local_160;
  size_t sStack_158;
  size_t local_150;
  char *local_148;
  char *local_140;
  size_t local_138;
  size_t local_130;
  size_t sStack_128;
  size_t local_120;
  size_t sStack_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  char *local_f8;
  size_t sStack_f0;
  size_t local_e8;
  char *local_e0;
  size_t sStack_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t sStack_a8;
  size_t local_a0;
  char *local_98;
  char *local_90;
  StringTree *local_88;
  StringTree *local_80;
  ArrayPtr<const_char> *local_78;
  StringTree *local_70;
  ArrayPtr<const_char> *local_68;
  size_t local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_168 = this->size_;
  local_38 = (params->text).content.ptr;
  local_160 = local_38;
  local_40 = params_1->size_;
  sStack_158 = local_40;
  local_48 = params_2->size_;
  local_150 = local_48;
  local_148 = params_3->ptr;
  local_50 = (params_4->text).content.ptr;
  local_140 = local_50;
  local_138 = params_5->size_ - 1;
  if (params_5->size_ == 0) {
    local_138 = sVar3;
  }
  local_58 = (params_6->content).size_;
  local_130 = local_58;
  local_60 = params_7->size_;
  sStack_128 = local_60;
  local_120 = params_8->size_;
  sStack_118 = params_9->size_;
  local_110 = params_10->size_;
  local_108 = params_11->size_ - 1;
  if (params_11->size_ == 0) {
    local_108 = sVar3;
  }
  local_100 = (params_12->content).size_;
  local_f8 = params_13->ptr;
  sStack_f0 = params_14->size_;
  local_e8 = params_15->size_;
  local_e0 = (params_16->text).content.ptr;
  sStack_d8 = params_17->size_;
  local_d0 = params_18->size_;
  local_c8 = params_19->size_ - 1;
  if (params_19->size_ == 0) {
    local_c8 = sVar3;
  }
  local_c0 = (params_20->content).size_;
  local_b8 = params_21->size_ - 1;
  if (params_21->size_ == 0) {
    local_b8 = sVar3;
  }
  local_b0 = (params_22->content).size_;
  sStack_a8 = params_23->size_;
  local_a0 = params_24->size_;
  local_98 = params_25->ptr;
  local_90 = (params_26->text).content.ptr;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_168 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xe0);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_168 = 0;
  local_148 = (char *)0x0;
  local_138 = 0;
  local_108 = 0;
  local_f8 = (char *)0x0;
  sStack_f0 = 0;
  local_e8 = 0;
  local_c8 = 0;
  local_b8 = 0;
  local_98 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_168 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xe0);
  local_88 = this;
  local_80 = params;
  local_78 = params_1;
  local_70 = (StringTree *)params_3;
  local_68 = params_2;
  heapString(&local_188,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_188.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_188.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_188.content.disposer;
  local_168 = 1;
  local_160 = (char *)0x0;
  sStack_158 = 0;
  sVar3 = 0;
  local_150 = 0;
  local_148 = (char *)0x1;
  local_140 = (char *)0x0;
  local_138 = 1;
  local_130 = 0;
  sStack_128 = 0;
  local_120 = 0;
  sStack_118 = 0;
  local_110 = 0;
  local_108 = 1;
  local_100 = 0;
  local_f8 = (char *)0x1;
  sStack_f0 = 1;
  local_e8 = 1;
  local_e0 = (char *)0x0;
  sStack_d8 = 0;
  local_d0 = 0;
  local_c8 = 1;
  local_c0 = 0;
  local_b8 = 1;
  local_a0 = 0;
  local_b0 = 0;
  sStack_a8 = 0;
  local_98 = (char *)0x1;
  local_90 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_168 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xe0);
  local_188.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_188.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_188.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_188.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_188.content.size_;
  (__return_storage_ptr__->branches).disposer = local_188.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,local_88,(ArrayPtr<const_char> *)local_80,local_78,
             local_68,local_70,(ArrayPtr<const_char> *)params_4,(String *)params_5,
             (ArrayPtr<const_char> *)params_6,params_7,params_8,params_9,params_10,
             (String *)params_11,(ArrayPtr<const_char> *)params_12,(StringTree *)params_13,params_14
             ,params_15,(ArrayPtr<const_char> *)params_16,params_17,params_18,(String *)params_19,
             (ArrayPtr<const_char> *)params_20,(String *)params_21,(ArrayPtr<const_char> *)params_22
             ,params_23,params_24,(StringTree *)params_25,(ArrayPtr<const_char> *)params_26);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}